

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  int iVar4;
  array_container_t *paVar5;
  bitset_container_t *bitset;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int32_t rlepos;
  long lVar9;
  uint32_t end;
  uint32_t start;
  ulong uVar10;
  ulong uVar11;
  
  iVar4 = run_container_cardinality(src_1);
  if (iVar4 < 0x1001) {
    paVar5 = array_container_create_given_capacity(iVar4);
    paVar5->cardinality = 0;
    uVar8 = 0;
    uVar6 = (ulong)(uint)src_1->n_runs;
    if (src_1->n_runs < 1) {
      uVar6 = uVar8;
    }
    for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      uVar1 = src_1->runs[uVar10].value;
      uVar2 = src_1->runs[uVar10].length;
      puVar3 = src_2->words;
      for (uVar11 = (ulong)uVar1; (uint)uVar11 <= (uint)uVar2 + (uint)uVar1;
          uVar11 = (ulong)((uint)uVar11 + 1)) {
        if ((*(ulong *)((long)puVar3 + (ulong)((uint)(uVar11 >> 3) & 0x1ff8)) >> (uVar11 & 0x3f) & 1
            ) == 0) {
          iVar4 = (int)uVar8;
          uVar7 = iVar4 + 1;
          uVar8 = (ulong)uVar7;
          paVar5->cardinality = uVar7;
          paVar5->array[iVar4] = (uint16_t)uVar11;
        }
      }
    }
    *dst = paVar5;
  }
  else {
    bitset = bitset_container_clone(src_2);
    start = 0;
    for (lVar9 = 0; lVar9 < src_1->n_runs; lVar9 = lVar9 + 1) {
      uVar1 = src_1->runs[lVar9].value;
      end = (uint)uVar1 + (uint)src_1->runs[lVar9].length + 1;
      puVar3 = bitset->words;
      bitset_reset_range(puVar3,start,(uint)uVar1);
      bitset_flip_range(puVar3,(uint)uVar1,end);
      start = end;
    }
    bitset_reset_range(bitset->words,start,0x10000);
    iVar4 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar4;
    if (0x1000 < iVar4) {
      *dst = bitset;
      return true;
    }
    paVar5 = array_container_from_bitset(bitset);
    *dst = paVar5;
    bitset_container_free(bitset);
  }
  return false;
}

Assistant:

bool run_bitset_container_andnot(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}